

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurfaceFunction::SetPoint(ON_OffsetSurfaceFunction *this,int index,double s,double t)

{
  int iVar1;
  ON_OffsetSurfaceValue *pOVar2;
  int count;
  double t_local;
  double s_local;
  int index_local;
  ON_OffsetSurfaceFunction *this_local;
  
  iVar1 = ON_SimpleArray<ON_OffsetSurfaceValue>::Count(&this->m_offset_value);
  if ((index < 0) || (iVar1 + -1 < index)) {
    this_local._7_1_ = false;
  }
  else {
    pOVar2 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,index);
    pOVar2->m_s = s;
    pOVar2 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,index);
    pOVar2->m_t = t;
    this->m_bValid = false;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetPoint( int index, double s, double t)
{
  int count = m_offset_value.Count();
  if( index < 0 || index > count-1)
    return false;

  m_offset_value[index].m_s = s;
  m_offset_value[index].m_t = t;
  m_bValid = false;

  return true;
}